

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

string * __thiscall
pbrt::TriQuadMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,TriQuadMesh *this)

{
  vector<int,_std::allocator<int>_> *unaff_RBX;
  
  StringPrintf<std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>const&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>const&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ TriQuadMesh p: %s n: %s uv: %s faceIndices: %s triIndices: %s quadIndices: %s ]",
             (char *)this,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&this->n,
             (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)&this->uv,
             (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             &this->faceIndices,&this->triIndices,&this->quadIndices,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string TriQuadMesh::ToString() const {
    return StringPrintf("[ TriQuadMesh p: %s n: %s uv: %s faceIndices: %s triIndices: %s "
                        "quadIndices: %s ]",
                        p, n, uv, faceIndices, triIndices, quadIndices);
}